

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O3

int listk(lua_State *L)

{
  StkId pTVar1;
  lua_CFunction p_Var2;
  long lVar3;
  int iVar4;
  char *__assertion;
  long lVar5;
  long n;
  
  iVar4 = lua_type(L,1);
  if (iVar4 == 6) {
    iVar4 = lua_iscfunction(L,1);
    if (iVar4 == 0) goto LAB_00134b94;
  }
  luaL_argerror(L,1,"Lua function expected");
LAB_00134b94:
  pTVar1 = L->ci->func;
  if (pTVar1[1].tt_ == 0x8006) {
    p_Var2 = pTVar1[1].value_.f;
    if (p_Var2[8] == (_func_int_lua_State_ptr)0x6) {
      lVar3 = *(long *)(p_Var2 + 0x18);
      lua_createtable(L,*(int *)(lVar3 + 0x14),0);
      if (0 < *(int *)(lVar3 + 0x14)) {
        lVar5 = 0;
        n = 0;
        do {
          pushobject(L,(TValue *)(*(long *)(lVar3 + 0x30) + lVar5));
          n = n + 1;
          lua_rawseti(L,-2,n);
          lVar5 = lVar5 + 0x10;
        } while (n < *(int *)(lVar3 + 0x14));
      }
      return 1;
    }
    __assertion = "((((L->ci->func + (1)))->value_).gc)->tt == ((6) | ((0) << 4))";
  }
  else {
    __assertion = "(((((L->ci->func + (1))))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                ,0x278,"int listk(lua_State *)");
}

Assistant:

static int listk (lua_State *L) {
  Proto *p;
  int i;
  luaL_argcheck(L, lua_isfunction(L, 1) && !lua_iscfunction(L, 1),
                 1, "Lua function expected");
  p = getproto(obj_at(L, 1));
  lua_createtable(L, p->sizek, 0);
  for (i=0; i<p->sizek; i++) {
    pushobject(L, p->k+i);
    lua_rawseti(L, -2, i+1);
  }
  return 1;
}